

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Scene::selectNextHalfedge(Scene *this)

{
  HalfedgeElement *pHVar1;
  long lVar2;
  
  pHVar1 = (this->selected).element;
  if (pHVar1 != (HalfedgeElement *)0x0) {
    lVar2 = __dynamic_cast(pHVar1,&HalfedgeElement::typeinfo,&Halfedge::typeinfo,0);
    if (lVar2 != 0) {
      (this->selected).element = (HalfedgeElement *)(*(long *)(lVar2 + 0x10) + 0x10);
    }
  }
  return;
}

Assistant:

void Scene::selectNextHalfedge() {
  if (selected.element) {
    Halfedge *h = selected.element->getHalfedge();
    if (h) {
      selected.element = elementAddress(h->next());
    }
  }
}